

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txrequest_tests.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_d715c4::Scenario::ReceivedInv
          (Scenario *this,NodeId peer,GenTxid *gtxid,bool pref,microseconds reqtime)

{
  long lVar1;
  anon_class_64_5_1d7ac728 *in_RDX;
  duration<long,_std::ratio<1L,_1000000L>_> *in_RSI;
  vector<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>,_std::allocator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_>_>
  *in_RDI;
  long in_FS_OFFSET;
  Runner *runner;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::
  vector<std::pair<std::chrono::duration<long,std::ratio<1l,1000000l>>,std::function<void()>>,std::allocator<std::pair<std::chrono::duration<long,std::ratio<1l,1000000l>>,std::function<void()>>>>
  ::
  emplace_back<std::chrono::duration<long,std::ratio<1l,1000000l>>&,(anonymous_namespace)::Scenario::ReceivedInv(long,GenTxid_const&,bool,std::chrono::duration<long,std::ratio<1l,1000000l>>)::_lambda()_1_>
            (in_RDI,in_RSI,in_RDX);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void ReceivedInv(NodeId peer, const GenTxid& gtxid, bool pref, std::chrono::microseconds reqtime)
    {
        auto& runner = m_runner;
        runner.actions.emplace_back(m_now, [=,&runner]() {
            runner.txrequest.ReceivedInv(peer, gtxid, pref, reqtime);
            runner.txrequest.SanityCheck();
        });
    }